

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularStringView::GenerateMergingCode
          (SingularStringView *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  SingularStringView *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::is_oneof(&this->super_FieldGeneratorBase);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "\n        if (oneof_needs_init) {\n          _this->$field_$.InitDefault();\n        }\n        _this->$field_$.Set(from._internal_$name$(), arena);\n      "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"\n        _this->_internal_set_$name$(from._internal_$name$());\n      ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_40._M_len,local_40._M_str);
  }
  return;
}

Assistant:

void GenerateMergingCode(io::Printer* p) const override {
    if (is_oneof()) {
      p->Emit(R"cc(
        if (oneof_needs_init) {
          _this->$field_$.InitDefault();
        }
        _this->$field_$.Set(from._internal_$name$(), arena);
      )cc");
    } else {
      p->Emit(R"cc(
        _this->_internal_set_$name$(from._internal_$name$());
      )cc");
    }
  }